

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createTriangleSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  undefined8 uVar5;
  Node *pNVar6;
  int iVar7;
  TriangleMeshNode *this_00;
  Vec3fa *pVVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  iterator iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint p00;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float phif;
  Triangle local_c0;
  float local_b4;
  long local_b0;
  float local_a8;
  float local_a4;
  ulong local_a0;
  TriangleMeshNode *local_98;
  ulong local_90;
  int local_88;
  float local_84;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  float local_50;
  uint local_4c;
  Node *local_48;
  ulong local_40;
  ulong local_38;
  
  local_a4 = radius;
  local_80 = N;
  this_00 = (TriangleMeshNode *)operator_new(0xd8);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_98 = this_00;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_48 = (Node *)this;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar17 = (int)local_80 * 2;
  local_78 = (ulong)uVar17;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (ulong)(((int)local_80 + 1) * uVar17);
  uVar11 = pvVar4->size_alloced;
  uVar15 = uVar11;
  if ((uVar11 < uVar18) && (uVar15 = uVar18, uVar14 = uVar11, uVar11 != 0)) {
    do {
      uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
      uVar14 = uVar15;
    } while (uVar15 < uVar18);
  }
  if (uVar18 < pvVar4->size_active) {
    pvVar4->size_active = uVar18;
  }
  if (uVar11 == uVar15) {
    pvVar4->size_active = uVar18;
  }
  else {
    ptr = pvVar4->items;
    pVVar8 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
    pvVar4->items = pVVar8;
    if (pvVar4->size_active != 0) {
      lVar16 = 0;
      uVar11 = 0;
      do {
        puVar3 = (undefined8 *)((long)&ptr->field_0 + lVar16);
        uVar5 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar16);
        *puVar2 = *puVar3;
        puVar2[1] = uVar5;
        uVar11 = uVar11 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar11 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar18;
    pvVar4->size_alloced = uVar15;
  }
  local_40 = local_78 & 0xffffffff;
  fVar19 = (float)local_40;
  auVar20 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  local_84 = (2.0 - fVar19 * auVar20._0_4_) * auVar20._0_4_;
  fVar19 = (float)(local_80 & 0xffffffff);
  auVar20 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  local_50 = (2.0 - fVar19 * auVar20._0_4_) * auVar20._0_4_;
  iVar10 = (int)local_78;
  local_68 = (ulong)(iVar10 - 1);
  local_98 = (TriangleMeshNode *)&local_98->triangles;
  local_4c = iVar10 * (int)local_80;
  local_38 = (ulong)(uint)(((int)local_80 + -1) * iVar10);
  local_70 = (ulong)(uint)-iVar10;
  local_88 = 0;
  lVar16 = 0;
  uVar15 = 0;
  uVar11 = local_78;
  local_60 = local_70;
  do {
    uVar18 = local_40;
    local_a0 = uVar15;
    if ((int)uVar11 != 0) {
      local_90 = CONCAT44(local_90._4_4_,(float)uVar15 * 3.1415927 * local_50);
      uVar11 = 0;
      do {
        local_b4 = ((float)(uVar11 & 0xffffffff) + (float)(uVar11 & 0xffffffff)) * 3.1415927 *
                   local_84;
        local_b0._0_4_ = (center->field_0).m128[0];
        local_a8 = sinf((float)local_90);
        local_a8 = local_a8 * local_a4;
        fVar19 = sinf(local_b4);
        uVar17 = (int)lVar16 + (int)uVar11;
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[0] =
             fVar19 * local_a8 + (float)local_b0;
        local_b0._0_4_ = (center->field_0).m128[1];
        fVar19 = cosf((float)local_90);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[1] =
             fVar19 * local_a4 + (float)local_b0;
        local_b0 = CONCAT44(local_b0._4_4_,(center->field_0).m128[2]);
        local_a8 = sinf((float)local_90);
        local_a8 = local_a8 * local_a4;
        fVar19 = cosf(local_b4);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[2] =
             fVar19 * local_a8 + (float)local_b0;
        uVar11 = uVar11 + 1;
      } while (uVar18 != uVar11);
    }
    uVar15 = local_68;
    uVar11 = local_78;
    local_b0 = lVar16;
    if ((int)local_a0 != 0) {
      iVar10 = (int)local_78;
      if ((int)local_a0 == 1) {
        if (iVar10 != 0) {
          iVar9 = 1;
          do {
            iVar7 = iVar9;
            if ((int)local_70 + iVar9 == 0) {
              iVar7 = 0;
            }
            local_c0.v1 = (uint)uVar15;
            local_c0.v0 = local_c0.v1 + iVar9;
            local_c0.v2 = iVar7 + iVar10;
            iVar12._M_current =
                 (this_00->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (this_00->triangles).
                super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                        ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          *)local_98,iVar12,&local_c0);
            }
            else {
              (iVar12._M_current)->v2 = local_c0.v2;
              (iVar12._M_current)->v0 = local_c0.v0;
              (iVar12._M_current)->v1 = local_c0.v1;
              ppTVar1 = &(this_00->triangles).
                         super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
            iVar7 = (int)local_70 + iVar9;
            iVar9 = iVar9 + 1;
          } while (iVar7 != 0);
        }
      }
      else if ((int)local_a0 == (uint)local_80) {
        if (iVar10 != 0) {
          iVar10 = 1;
          do {
            iVar9 = iVar10;
            if ((int)local_70 + iVar10 == 0) {
              iVar9 = 0;
            }
            local_c0.v1 = ((int)local_38 + iVar10) - 1;
            local_c0.v2 = iVar9 + (int)local_38;
            local_c0.v0 = local_4c;
            iVar12._M_current =
                 (this_00->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (this_00->triangles).
                super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                        ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          *)local_98,iVar12,&local_c0);
            }
            else {
              (iVar12._M_current)->v2 = local_c0.v2;
              (iVar12._M_current)->v0 = local_4c;
              (iVar12._M_current)->v1 = local_c0.v1;
              ppTVar1 = &(this_00->triangles).
                         super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
            iVar9 = (int)local_70 + iVar10;
            iVar10 = iVar10 + 1;
          } while (iVar9 != 0);
        }
      }
      else if (iVar10 != 0) {
        local_b4 = (float)(((int)local_a0 + -1) * iVar10);
        local_90 = (ulong)(uint)((int)local_a0 * iVar10);
        iVar10 = 0;
        do {
          iVar7 = iVar10 + 1;
          uVar17 = (int)local_60 + iVar10;
          iVar9 = iVar7;
          if ((int)local_68 == iVar10) {
            iVar9 = 0;
          }
          local_c0.v0 = iVar10 + local_88;
          uVar13 = iVar9 + (int)local_90;
          iVar12._M_current =
               (this_00->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this_00->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_c0.v1 = uVar17;
            local_c0.v2 = uVar13;
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_98,iVar12,&local_c0);
            iVar12._M_current =
                 (this_00->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->v2 = uVar13;
            (iVar12._M_current)->v0 = local_c0.v0;
            (iVar12._M_current)->v1 = uVar17;
            iVar12._M_current =
                 (this_00->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this_00->triangles).
            super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_c0.v0 = iVar9 + (int)local_b4;
          local_c0.v1 = uVar13;
          local_c0.v2 = uVar17;
          if (iVar12._M_current ==
              (this_00->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_98,iVar12,&local_c0);
          }
          else {
            (iVar12._M_current)->v2 = uVar17;
            (iVar12._M_current)->v0 = local_c0.v0;
            (iVar12._M_current)->v1 = uVar13;
            ppTVar1 = &(this_00->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          uVar11 = local_78;
          iVar10 = iVar7;
        } while ((int)local_78 != iVar7);
      }
    }
    pNVar6 = local_48;
    uVar17 = (int)local_a0 + 1;
    uVar15 = (ulong)uVar17;
    lVar16 = local_b0 + local_40;
    local_60 = (ulong)(uint)((int)local_60 + (int)uVar11);
    local_88 = local_88 + (int)uVar11;
  } while (uVar17 <= (uint)local_80);
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar6;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTriangleSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p01,p11,p00));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }